

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O0

bool __thiscall
Am_Object_Data::propagate_change(Am_Object_Data *this,Am_Slot_Key key,Am_Constraint *cause)

{
  bool bVar1;
  bool local_31;
  Am_Object_Data *local_30;
  Am_Object_Data *current;
  bool no_inherit;
  Am_Constraint *cause_local;
  Am_Slot_Key key_local;
  Am_Object_Data *this_local;
  
  current._7_1_ = true;
  for (local_30 = this->first_instance; local_30 != (Am_Object_Data *)0x0;
      local_30 = local_30->next_instance) {
    bVar1 = notify_change(local_30,key,cause);
    local_31 = false;
    if (bVar1) {
      local_31 = current._7_1_;
    }
    current._7_1_ = local_31;
  }
  return current._7_1_;
}

Assistant:

bool
Am_Object_Data::propagate_change(Am_Slot_Key key, Am_Constraint *cause)
{
#ifdef DEBUG
  Global_Reason_Why_Set |= Am_TRACE_INHERITANCE_PROPAGATION;
#endif
  bool no_inherit = true;
  Am_Object_Data *current = first_instance;
  while (current) {
    no_inherit = current->notify_change(key, cause) && no_inherit;
    current = current->next_instance;
  }
#ifdef DEBUG
  Global_Reason_Why_Set &= ~Am_TRACE_INHERITANCE_PROPAGATION;
#endif
  return no_inherit;
}